

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8CachePolicy.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen8CachePolicy::BestMatchingPATIdx
          (GmmGen8CachePolicy *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  Context *pCVar1;
  bool bVar2;
  GMM_CACHE_POLICY_ELEMENT CachePolicy_00;
  undefined1 auVar3 [32];
  uint uVar4;
  GMM_GFX_MEMORY_TYPE GVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  GMM_GFX_MEMORY_TYPE GVar9;
  uint uVar10;
  GMM_PRIVATE_PAT *pGVar11;
  ulong uVar12;
  GMM_GFX_MEMORY_TYPE GVar13;
  undefined8 in_stack_ffffffffffffffe0;
  
  auVar3 = CachePolicy._8_32_;
  CachePolicy_00._32_8_ = in_stack_ffffffffffffffe0;
  CachePolicy_00.IDCode = auVar3._0_4_;
  CachePolicy_00._4_4_ = auVar3._4_4_;
  CachePolicy_00.field_1 = (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)auVar3._8_8_;
  CachePolicy_00.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)auVar3._16_4_;
  CachePolicy_00.field_3 = (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)auVar3._20_4_
  ;
  CachePolicy_00.PTE = (GMM_PTE_CACHE_CONTROL_BITS)auVar3._24_8_;
  GVar5 = GmmCachePolicyCommon::GetWantedMemoryType
                    (&this->super_GmmCachePolicyCommon,CachePolicy_00);
  uVar10 = 1;
  if (((undefined1  [40])CachePolicy & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
    uVar10 = (uint)(((undefined1  [40])CachePolicy & (undefined1  [40])0x2) == (undefined1  [40])0x0
                   ) * 3;
  }
  uVar8 = 3;
  if ((~CachePolicy.field_1._0_4_ & 3) != 0) {
    uVar8 = uVar10;
  }
  uVar10 = (this->super_GmmCachePolicyCommon).NumPATRegisters;
  pCVar1 = (this->super_GmmCachePolicyCommon).pGmmLibContext;
  pGVar11 = pCVar1->PrivatePATTable;
  uVar7 = 0;
  for (uVar12 = 1; pGVar11 = pGVar11 + 1, uVar12 < uVar10; uVar12 = uVar12 + 1) {
    GVar9 = GMM_GFX_UC_WITH_FENCE;
    if (uVar7 < uVar10) {
      GVar9 = pCVar1->PrivatePATTable[uVar7].Value;
    }
    GVar13 = pGVar11->Value & GMM_GFX_WB;
    if ((GVar9 & GMM_GFX_WB) == GVar5) {
      bVar2 = ((pGVar11->Value >> 2 & 3) == uVar8 && GVar13 == GVar5) && uVar8 != (GVar9 >> 2 & 3);
    }
    else {
      bVar2 = GVar13 == GMM_GFX_UC_WITH_FENCE || GVar13 == GVar5;
    }
    uVar4 = (uint)uVar12;
    if (!bVar2) {
      uVar4 = uVar7;
    }
    uVar7 = uVar4;
  }
  GVar9 = GMM_GFX_UC_WITH_FENCE;
  if (uVar7 < uVar10) {
    GVar9 = pCVar1->PrivatePATTable[uVar7].Value & GMM_GFX_WB;
  }
  uVar6 = 0xffffffff;
  if (GVar9 == GVar5) {
    uVar6 = uVar7;
  }
  return uVar6;
}

Assistant:

uint32_t GmmLib::GmmGen8CachePolicy::BestMatchingPATIdx(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    uint32_t             i;
    uint32_t             PATIdx           = 0;
    GMM_GFX_MEMORY_TYPE  WantedMemoryType = GMM_GFX_UC_WITH_FENCE, MemoryType;
    GMM_GFX_TARGET_CACHE WantedTC         = GMM_GFX_TC_ELLC_LLC;

    WantedMemoryType = GetWantedMemoryType(CachePolicy);

    if(CachePolicy.LLC && CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_LLC;
    }
    else if(CachePolicy.LLC)
    {
        WantedTC = GMM_GFX_TC_LLC_ONLY;
    }
    else if(CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_ONLY; // Note: this overrides the MOCS target cache selection.
    }

    for(i = 1; i < NumPATRegisters; i++)
    {
        GMM_PRIVATE_PAT PAT1 = GetPrivatePATEntry(PATIdx);
        GMM_PRIVATE_PAT PAT2 = GetPrivatePATEntry(i);

        if(SelectNewPATIdx(WantedMemoryType, WantedTC,
                           (GMM_GFX_MEMORY_TYPE)PAT1.PreGen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT1.PreGen10.TargetCache,
                           (GMM_GFX_MEMORY_TYPE)PAT2.PreGen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT2.PreGen10.TargetCache))
        {
            PATIdx = i;
        }
    }

    MemoryType = (GMM_GFX_MEMORY_TYPE)GetPrivatePATEntry(PATIdx).PreGen10.MemoryType;

    if(MemoryType != WantedMemoryType)
    {
        // Failed to find a matching PAT entry
        return GMM_PAT_ERROR;
    }
    return PATIdx;
}